

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O1

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
getPredefinedTransformations2Plane1Line<float>
          (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           *__return_storage_ptr__,Matrix<float,_4,_1,_0,_4,_1> *Pi1,
          Matrix<float,_4,_1,_0,_4,_1> *Pi2,Matrix<float,_4,_1,_0,_4,_1> *Nu1,
          Matrix<float,_4,_1,_0,_4,_1> *Nu2,bool verbose)

{
  float fVar1;
  float fVar2;
  float fVar3;
  iterator iVar4;
  double dVar5;
  ulong uVar6;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar7;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *pCVar8;
  long lVar9;
  ostream *poVar10;
  char *__function;
  DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *pDVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  double dVar19;
  double dVar20;
  float fVar21;
  float fVar22;
  double dVar23;
  double dVar24;
  Matrix<float,_3,_1,_0,_3,_1> auxT;
  Matrix<float,_4,_4,_0,_4,_4> auxTrans;
  Matrix<float,_3,_3,_0,_3,_3> auxRot;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_228;
  double local_208;
  float local_200;
  float local_1fc;
  undefined1 local_1f8 [16];
  undefined8 local_1e8;
  uint uStack_1e0;
  uint uStack_1dc;
  undefined1 local_1d8 [16];
  float local_1c4;
  float local_1c0;
  float local_1bc;
  undefined1 local_1b8 [16];
  float local_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  double local_198;
  uint uStack_190;
  uint uStack_18c;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  float local_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  float local_150;
  float local_14c;
  float local_148;
  float local_144;
  float local_140;
  float local_13c;
  float local_138;
  float local_134;
  float fStack_130;
  float local_12c;
  undefined8 local_128;
  uint uStack_120;
  uint uStack_11c;
  float local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined1 local_108 [16];
  Matrix<float,_4,_4,_0,_4,_4> local_f8;
  double local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  float local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_54 [9];
  
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168 = (Pi1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[0];
  fVar1 = (Pi1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [1];
  local_1e8._0_4_ =
       (Pi1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[2];
  local_1a8 = (Pi2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[0];
  fVar2 = (Pi2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [1];
  fVar3 = (Pi2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [2];
  fVar21 = (float)local_1e8 * (float)local_1e8;
  fVar22 = fVar1 * fVar1;
  dVar23 = (double)(fVar22 + fVar21);
  local_68 = ZEXT416((uint)(local_168 * fVar1));
  local_78 = ZEXT416((uint)(local_168 * (float)local_1e8));
  local_188._0_4_ = fVar2;
  local_1f8 = ZEXT416((uint)fVar1);
  local_178._0_4_ = fVar3;
  dVar19 = (double)(fVar1 * fVar3 - fVar2 * (float)local_1e8);
  local_118 = local_168 * local_168;
  local_88 = ZEXT416((uint)fVar22);
  local_108 = ZEXT416((uint)fVar21);
  fVar12 = local_118 + fVar22 + fVar21;
  local_128 = (double)(((fVar22 * local_1a8 + fVar21 * local_1a8) - local_168 * fVar1 * fVar2) -
                      local_168 * (float)local_1e8 * fVar3);
  local_208 = local_128 * local_128 * dVar23 + (double)fVar12 * dVar19 * dVar19 * dVar23;
  local_1d8 = ZEXT416((uint)(float)local_1e8);
  local_a8 = -0.0;
  uStack_a4 = 0x80000000;
  uStack_a0 = 0x80000000;
  uStack_9c = 0x80000000;
  local_1e8._0_4_ = -(float)local_1e8;
  local_1e8._4_4_ = 0x80000000;
  uStack_1e0 = 0x80000000;
  uStack_1dc = 0x80000000;
  local_1bc = (Pi1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  local_150 = (Pi2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  fVar1 = (Nu1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [0];
  local_1b8 = ZEXT416((uint)(Nu1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                            m_storage.m_data.array[1]);
  local_98 = ZEXT416((uint)(Nu1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                           m_storage.m_data.array[2]);
  local_1c0 = (Nu1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  fVar2 = (Nu2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (Nu2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [1];
  fVar21 = (Nu2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [2];
  local_1c4 = (Nu2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  dVar20 = SQRT(local_208);
  dVar5 = dVar20;
  if (local_208 < 0.0) {
    local_198 = dVar19;
    local_b8 = dVar20;
    dVar20 = sqrt(local_208);
    dVar19 = local_198;
    dVar5 = local_b8;
  }
  local_54[0] = (float)((1.0 / dVar20) * dVar19 * dVar23);
  pDVar11 = (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_54;
  local_228.m_row = 0;
  local_228.m_col = 1;
  local_228.m_currentBlockRows = 1;
  local_228.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)pDVar11;
  if (local_208 < 0.0) {
    dVar5 = sqrt(local_208);
  }
  local_1fc = (float)((double)(local_168 * (float)local_178._0_4_ + local_1a8 * (float)local_1e8) *
                      (-1.0 / dVar5) * dVar23);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (&local_228,&local_1fc);
  if (local_208 < 0.0) {
    dVar20 = sqrt(local_208);
  }
  else {
    dVar20 = SQRT(local_208);
  }
  local_200 = (float)((double)(local_168 * (float)local_188._0_4_ -
                              local_1a8 * (float)local_1f8._0_4_) * (1.0 / dVar20) * dVar23);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar7,&local_200);
  if (local_208 < 0.0) {
    dVar20 = sqrt(local_208);
  }
  else {
    dVar20 = SQRT(local_208);
  }
  dVar20 = (-1.0 / dVar20) * dVar23;
  if (fVar12 < 0.0) {
    local_198 = dVar20;
    fVar22 = sqrtf(fVar12);
    dVar20 = local_198;
  }
  else {
    fVar22 = SQRT(fVar12);
  }
  local_138 = (float)((dVar20 / (double)fVar22) * local_128);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar7,&local_138);
  uStack_120 = local_68._8_4_ ^ 0x80000000;
  uStack_11c = local_68._12_4_ ^ 0x80000000;
  local_128 = (double)(local_68._0_8_ ^ 0x8000000080000000);
  if (local_208 < 0.0) {
    dVar20 = sqrt(local_208);
  }
  else {
    dVar20 = SQRT(local_208);
  }
  dVar20 = (-1.0 / dVar20) * dVar23;
  if (fVar12 < 0.0) {
    local_198 = dVar20;
    fVar22 = sqrtf(fVar12);
    dVar20 = local_198;
  }
  else {
    fVar22 = SQRT(fVar12);
  }
  fVar13 = (float)local_128 * local_1a8;
  local_128._0_4_ = (float)local_1f8._0_4_ * (float)local_1d8._0_4_;
  local_128._4_4_ = local_1f8._4_4_;
  uStack_120 = local_1f8._8_4_;
  uStack_11c = local_1f8._12_4_;
  local_13c = (float)((double)((fVar13 + local_118 * (float)local_188._0_4_ +
                                         (float)local_108._0_4_ * (float)local_188._0_4_) -
                              (float)local_128 * (float)local_178._0_4_) * (dVar20 / (double)fVar22)
                     );
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar7,&local_13c);
  uStack_190 = local_78._8_4_ ^ 0x80000000;
  uStack_18c = local_78._12_4_ ^ 0x80000000;
  local_198 = (double)(local_78._0_8_ ^ 0x8000000080000000);
  uVar6 = CONCAT44(uStack_11c,uStack_120) ^ 0x8000000080000000;
  uStack_b0 = (undefined4)uVar6;
  uStack_ac = (undefined4)(uVar6 >> 0x20);
  local_b8 = (double)(CONCAT44(local_128._4_4_,(float)local_128) ^ 0x8000000080000000);
  if (local_208 < 0.0) {
    dVar20 = sqrt(local_208);
  }
  else {
    dVar20 = SQRT(local_208);
  }
  if (fVar12 < 0.0) {
    fVar22 = sqrtf(fVar12);
  }
  else {
    fVar22 = SQRT(fVar12);
  }
  local_140 = (float)((double)(local_b8._0_4_ * (float)local_188._0_4_ +
                              local_198._0_4_ * local_1a8 +
                              local_118 * (float)local_178._0_4_ +
                              (float)local_88._0_4_ * (float)local_178._0_4_) *
                     (((-1.0 / dVar20) * dVar23) / (double)fVar22));
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar7,&local_140);
  if (fVar12 < 0.0) {
    local_144 = sqrtf(fVar12);
  }
  else {
    local_144 = SQRT(fVar12);
  }
  local_144 = local_168 / local_144;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar7,&local_144);
  if (fVar12 < 0.0) {
    local_148 = sqrtf(fVar12);
  }
  else {
    local_148 = SQRT(fVar12);
  }
  local_148 = (float)local_1f8._0_4_ / local_148;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar7,&local_148);
  if (fVar12 < 0.0) {
    local_14c = sqrtf(fVar12);
  }
  else {
    local_14c = SQRT(fVar12);
  }
  local_14c = (float)local_1d8._0_4_ / local_14c;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar7,&local_14c);
  if (((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
       (local_228.m_row + local_228.m_currentBlockRows) ==
       (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)0x3) && (local_228.m_col == 3)) {
    local_1f8._0_8_ = local_1f8._0_8_ ^ 0x8000000080000000;
    local_1f8._8_4_ = local_1f8._8_4_ ^ 0x80000000;
    local_1f8._12_4_ = local_1f8._12_4_ ^ 0x80000000;
    local_228.m_row = 0;
    local_228.m_col = 1;
    local_228.m_currentBlockRows = 1;
    local_134 = 0.0;
    local_228.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)&local_134;
    if (fVar12 < 0.0) {
      fVar22 = sqrtf(fVar12);
    }
    else {
      fVar22 = SQRT(fVar12);
    }
    fVar13 = (float)local_88._0_4_ * local_150;
    fVar14 = local_118 * local_150;
    fVar17 = local_150 * (float)local_108._0_4_;
    fVar15 = local_168 * local_1bc * local_1a8;
    fVar16 = (float)local_1f8._0_4_ * local_1bc * (float)local_188._0_4_;
    fVar18 = (float)local_1e8 * local_1bc * (float)local_178._0_4_;
    dVar20 = (double)((float)local_68._0_4_ * local_1a8 * (float)local_188._0_4_);
    dVar5 = (double)((float)local_78._0_4_ * local_1a8 * (float)local_178._0_4_);
    dVar19 = (double)((float)local_128 * (float)local_188._0_4_ * (float)local_178._0_4_);
    dVar20 = (((double)((float)local_188._0_4_ * (float)local_188._0_4_ * (float)local_108._0_4_ +
                       (float)local_178._0_4_ * (float)local_178._0_4_ * (float)local_88._0_4_ +
                       local_1a8 * local_1a8 * (float)local_108._0_4_ +
                       local_118 * (float)local_178._0_4_ * (float)local_178._0_4_ +
                       local_118 * (float)local_188._0_4_ * (float)local_188._0_4_ +
                       (float)local_88._0_4_ * local_1a8 * local_1a8) - (dVar20 + dVar20)) -
             (dVar5 + dVar5)) - (dVar19 + dVar19);
    if (dVar20 < 0.0) {
      dVar20 = sqrt(dVar20);
    }
    else {
      dVar20 = SQRT(dVar20);
    }
    local_1fc = (float)(((double)(fVar18 + fVar16 + ((fVar17 + fVar14 + fVar13) - fVar15)) *
                        (-1.0 / (double)fVar22)) / dVar20);
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_228,
                        &local_1fc);
    if (fVar12 < 0.0) {
      fVar12 = sqrtf(fVar12);
    }
    else {
      fVar12 = SQRT(fVar12);
    }
    local_200 = local_1bc / fVar12;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(pCVar8,&local_200);
    if (((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
         (local_228.m_row + local_228.m_currentBlockRows) ==
         (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)0x3) && (local_228.m_col == 1)) {
      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
           = 1.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
           = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
           = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
           = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
           = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
           = 1.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
           = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7]
           = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8]
           = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9]
           = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [10] = 1.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xb] = 0.0;
      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xf] = 1.0;
      lVar9 = 0;
      do {
        *(undefined4 *)
         ((long)local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar9 + 8) = *(undefined4 *)(pDVar11 + 8);
        *(undefined8 *)
         ((long)local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar9) = *(undefined8 *)pDVar11;
        pDVar11 = pDVar11 + 0xc;
        lVar9 = lVar9 + 0x10;
      } while (lVar9 != 0x30);
      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xe] = local_12c;
      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xc] = local_134;
      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xd] = fStack_130;
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[VERBOSE] Matrix [U,u;0,0,0,1]",0x1e);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        poVar10 = (ostream *)std::ostream::flush();
        poVar10 = Eigen::operator<<(poVar10,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                                            &local_f8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        if (verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)",0x1b);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          poVar10 = (ostream *)std::ostream::flush();
          local_228.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)&local_f8;
          local_228.m_row = (Index)&local_f8;
          poVar10 = Eigen::operator<<(poVar10,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                                               *)&local_228);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
        }
      }
      iVar4._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>::
        _M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                  ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                    *)__return_storage_ptr__,iVar4,&local_f8);
      }
      else {
        *(ulong *)(((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
                   .m_storage.m_data.array + 0xc) =
             CONCAT44(local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[0xd],
                      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[0xc]);
        *(ulong *)(((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
                   .m_storage.m_data.array + 0xe) =
             CONCAT44(local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[0xf],
                      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[0xe]);
        *(undefined8 *)
         (((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array + 8) =
             local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array._32_8_;
        *(ulong *)(((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
                   .m_storage.m_data.array + 10) =
             CONCAT44(local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[0xb],
                      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[10]);
        *(ulong *)(((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
                   .m_storage.m_data.array + 4) =
             CONCAT44(local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[5],
                      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[4]);
        *(undefined8 *)
         (((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array + 6) =
             local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array._24_8_;
        *(ulong *)((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                  m_storage.m_data.array =
             CONCAT44(local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[1],
                      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[0]);
        *(ulong *)(((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
                   .m_storage.m_data.array + 2) =
             CONCAT44(local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[3],
                      local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[2]);
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      local_168 = (float)local_98._0_4_ * (float)local_98._0_4_;
      local_118 = (float)local_1b8._0_4_ * (float)local_1b8._0_4_;
      dVar23 = (double)(local_118 + local_168);
      local_178 = ZEXT416((uint)(fVar1 * (float)local_1b8._0_4_));
      local_188 = ZEXT416((uint)(fVar1 * (float)local_98._0_4_));
      local_1e8 = (double)(((local_118 * fVar2 + local_168 * fVar2) -
                           fVar1 * (float)local_1b8._0_4_ * fVar3) -
                          fVar1 * (float)local_98._0_4_ * fVar21);
      local_1a8 = -(float)local_98._0_4_;
      uStack_1a4 = local_98._4_4_ ^ 0x80000000;
      uStack_1a0 = local_98._8_4_ ^ 0x80000000;
      uStack_19c = local_98._12_4_ ^ 0x80000000;
      dVar19 = (double)((float)local_1b8._0_4_ * fVar21 - fVar3 * (float)local_98._0_4_);
      local_208 = (double)CONCAT44(local_208._4_4_,fVar1 * fVar1);
      uStack_114 = local_1b8._4_4_;
      uStack_110 = local_1b8._8_4_;
      uStack_10c = local_1b8._12_4_;
      uStack_164 = local_98._4_4_;
      uStack_160 = local_98._8_4_;
      uStack_15c = local_98._12_4_;
      fVar12 = fVar1 * fVar1 + local_118 + local_168;
      local_1f8._0_8_ = local_1e8 * local_1e8 * dVar23 + (double)fVar12 * dVar19 * dVar19 * dVar23;
      dVar20 = SQRT((double)local_1f8._0_8_);
      dVar24 = (double)local_1f8._0_8_;
      dVar5 = dVar20;
      if ((double)local_1f8._0_8_ < 0.0) {
        local_1d8._0_8_ = dVar20;
        local_108._0_8_ = dVar19;
        dVar20 = sqrt((double)local_1f8._0_8_);
        dVar24 = (double)local_1f8._0_8_;
        dVar19 = (double)local_108._0_8_;
        dVar5 = (double)local_1d8._0_8_;
      }
      local_54[0] = (float)((1.0 / dVar20) * dVar19 * dVar23);
      pDVar11 = (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_54;
      local_228.m_row = 0;
      local_228.m_col = 1;
      local_228.m_currentBlockRows = 1;
      local_228.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)pDVar11;
      if (dVar24 < 0.0) {
        dVar5 = sqrt((double)local_1f8._0_8_);
      }
      local_1fc = (float)((double)(fVar1 * fVar21 + fVar2 * local_1a8) * (-1.0 / dVar5) * dVar23);
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (&local_228,&local_1fc);
      if ((double)local_1f8._0_8_ < 0.0) {
        dVar20 = sqrt((double)local_1f8._0_8_);
      }
      else {
        dVar20 = SQRT((double)local_1f8._0_8_);
      }
      local_200 = (float)((double)(fVar1 * fVar3 - fVar2 * (float)local_1b8._0_4_) * (1.0 / dVar20)
                         * dVar23);
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar7,&local_200);
      if ((double)local_1f8._0_8_ < 0.0) {
        dVar20 = sqrt((double)local_1f8._0_8_);
      }
      else {
        dVar20 = SQRT((double)local_1f8._0_8_);
      }
      dVar20 = (-1.0 / dVar20) * dVar23;
      if (fVar12 < 0.0) {
        local_1d8._0_8_ = dVar20;
        fVar22 = sqrtf(fVar12);
        dVar20 = (double)local_1d8._0_8_;
      }
      else {
        fVar22 = SQRT(fVar12);
      }
      local_138 = (float)((dVar20 / (double)fVar22) * local_1e8);
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar7,&local_138);
      uStack_1e0 = local_178._8_4_ ^ 0x80000000;
      uStack_1dc = local_178._12_4_ ^ 0x80000000;
      local_1e8 = (double)(local_178._0_8_ ^ 0x8000000080000000);
      if ((double)local_1f8._0_8_ < 0.0) {
        dVar20 = sqrt((double)local_1f8._0_8_);
      }
      else {
        dVar20 = SQRT((double)local_1f8._0_8_);
      }
      dVar20 = (-1.0 / dVar20) * dVar23;
      if (fVar12 < 0.0) {
        local_1d8._0_8_ = dVar20;
        fVar22 = sqrtf(fVar12);
        dVar20 = (double)local_1d8._0_8_;
      }
      else {
        fVar22 = SQRT(fVar12);
      }
      fVar13 = (float)local_1e8 * fVar2;
      local_1e8._0_4_ = (float)local_1b8._0_4_ * (float)local_98._0_4_;
      local_1e8._4_4_ = local_1b8._4_4_;
      uStack_1e0 = local_1b8._8_4_;
      uStack_1dc = local_1b8._12_4_;
      local_13c = (float)((double)((fVar13 + local_208._0_4_ * fVar3 + local_168 * fVar3) -
                                  (float)local_1e8 * fVar21) * (dVar20 / (double)fVar22));
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar7,&local_13c);
      local_a8 = (float)((uint)local_a8 ^ local_188._0_4_);
      uStack_a4 = uStack_a4 ^ local_188._4_4_;
      uStack_a0 = uStack_a0 ^ local_188._8_4_;
      uStack_9c = uStack_9c ^ local_188._12_4_;
      local_1d8._0_8_ = CONCAT44(local_1e8._4_4_,(float)local_1e8) ^ 0x8000000080000000;
      local_1d8._8_4_ = uStack_1e0 ^ 0x80000000;
      local_1d8._12_4_ = uStack_1dc ^ 0x80000000;
      if ((double)local_1f8._0_8_ < 0.0) {
        dVar20 = sqrt((double)local_1f8._0_8_);
      }
      else {
        dVar20 = SQRT((double)local_1f8._0_8_);
      }
      if (fVar12 < 0.0) {
        fVar22 = sqrtf(fVar12);
      }
      else {
        fVar22 = SQRT(fVar12);
      }
      local_140 = (float)((double)((float)local_1d8._0_4_ * fVar3 +
                                  local_a8 * fVar2 + local_208._0_4_ * fVar21 + local_118 * fVar21)
                         * (((-1.0 / dVar20) * dVar23) / (double)fVar22));
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar7,&local_140);
      if (fVar12 < 0.0) {
        local_144 = sqrtf(fVar12);
      }
      else {
        local_144 = SQRT(fVar12);
      }
      local_144 = fVar1 / local_144;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar7,&local_144);
      if (fVar12 < 0.0) {
        local_148 = sqrtf(fVar12);
      }
      else {
        local_148 = SQRT(fVar12);
      }
      local_148 = (float)local_1b8._0_4_ / local_148;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar7,&local_148);
      if (fVar12 < 0.0) {
        local_14c = sqrtf(fVar12);
      }
      else {
        local_14c = SQRT(fVar12);
      }
      local_14c = (float)local_98._0_4_ / local_14c;
      Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar7,&local_14c);
      if (((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
           (local_228.m_row + local_228.m_currentBlockRows) !=
           (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)0x3) || (local_228.m_col != 3))
      goto LAB_00148f3f;
      local_1b8._0_8_ = local_1b8._0_8_ ^ 0x8000000080000000;
      local_1b8._8_4_ = local_1b8._8_4_ ^ 0x80000000;
      local_1b8._12_4_ = local_1b8._12_4_ ^ 0x80000000;
      local_228.m_row = 0;
      local_228.m_col = 1;
      local_228.m_currentBlockRows = 1;
      local_134 = 0.0;
      if (fVar12 < 0.0) {
        local_228.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)&local_134;
        fVar22 = sqrtf(fVar12);
      }
      else {
        fVar22 = SQRT(fVar12);
        local_228.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)&local_134;
      }
      dVar23 = (double)(local_1a8 * local_1c0 * fVar21 +
                       (float)local_1b8._0_4_ * local_1c0 * fVar3 +
                       ((local_1c4 * local_168 + local_208._0_4_ * local_1c4 + local_118 * local_1c4
                        ) - fVar1 * local_1c0 * fVar2)) * (-1.0 / (double)fVar22);
      dVar20 = (double)((float)local_178._0_4_ * fVar2 * fVar3);
      dVar5 = (double)((float)local_188._0_4_ * fVar2 * fVar21);
      dVar19 = (double)((float)local_1e8 * fVar3 * fVar21);
      dVar20 = (((double)(fVar3 * fVar3 * local_168 +
                         fVar21 * fVar21 * local_118 +
                         fVar2 * fVar2 * local_168 +
                         local_208._0_4_ * fVar21 * fVar21 +
                         local_208._0_4_ * fVar3 * fVar3 + local_118 * fVar2 * fVar2) -
                (dVar20 + dVar20)) - (dVar5 + dVar5)) - (dVar19 + dVar19);
      if (dVar20 < 0.0) {
        local_1b8._0_8_ = dVar23;
        dVar20 = sqrt(dVar20);
        dVar23 = (double)local_1b8._0_8_;
      }
      else {
        dVar20 = SQRT(dVar20);
      }
      local_1fc = (float)(dVar23 / dVar20);
      pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_228,
                          &local_1fc);
      if (fVar12 < 0.0) {
        fVar12 = sqrtf(fVar12);
      }
      else {
        fVar12 = SQRT(fVar12);
      }
      local_200 = local_1c0 / fVar12;
      Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(pCVar8,&local_200);
      if (((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
           (local_228.m_row + local_228.m_currentBlockRows) ==
           (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)0x3) && (local_228.m_col == 1)) {
        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0] = 1.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [1] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [2] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [3] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [4] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [5] = 1.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [6] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [7] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [8] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [9] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [10] = 1.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xb] = 0.0;
        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xf] = 1.0;
        lVar9 = 0;
        do {
          *(undefined4 *)
           ((long)local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar9 + 8) = *(undefined4 *)(pDVar11 + 8);
          *(undefined8 *)
           ((long)local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar9) = *(undefined8 *)pDVar11;
          pDVar11 = pDVar11 + 0xc;
          lVar9 = lVar9 + 0x10;
        } while (lVar9 != 0x30);
        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xe] = local_12c;
        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xc] = local_134;
        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xd] = fStack_130;
        if (verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[VERBOSE] Matrix [V,v;0,0,0,1]",0x1e);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          poVar10 = (ostream *)std::ostream::flush();
          poVar10 = Eigen::operator<<(poVar10,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                                              &local_f8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          if (verbose) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)",0x1b);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
            std::ostream::put('x');
            poVar10 = (ostream *)std::ostream::flush();
            local_228.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)&local_f8;
            local_228.m_row = (Index)&local_f8;
            poVar10 = Eigen::operator<<(poVar10,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                                                 *)&local_228);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
          }
        }
        iVar4._M_current =
             (__return_storage_ptr__->
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
          ::_M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                    ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                      *)__return_storage_ptr__,iVar4,&local_f8);
        }
        else {
          *(ulong *)(((iVar4._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 0xc) =
               CONCAT44(local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0xd],
                        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0xc]);
          *(ulong *)(((iVar4._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 0xe) =
               CONCAT44(local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0xf],
                        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0xe]);
          *(undefined8 *)
           (((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array + 8) =
               local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
               .array._32_8_;
          *(ulong *)(((iVar4._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 10) =
               CONCAT44(local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0xb],
                        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[10]);
          *(ulong *)(((iVar4._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 4) =
               CONCAT44(local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[5],
                        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[4]);
          *(undefined8 *)
           (((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array + 6) =
               local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
               .array._24_8_;
          *(ulong *)((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                    ).m_storage.m_data.array =
               CONCAT44(local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[1],
                        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0]);
          *(ulong *)(((iVar4._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 2) =
               CONCAT44(local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[3],
                        local_f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[2]);
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        return __return_storage_ptr__;
      }
    }
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 1>>::finished() [MatrixType = Eigen::Matrix<float, 3, 1>]"
    ;
  }
  else {
LAB_00148f3f:
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 3>>::finished() [MatrixType = Eigen::Matrix<float, 3, 3>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> getPredefinedTransformations2Plane1Line(
	Matrix<floatPrec, 4, 1> Pi1, Matrix<floatPrec, 4, 1> Pi2,
	Matrix<floatPrec, 4, 1> Nu1, Matrix<floatPrec, 4, 1> Nu2,
	bool verbose)
{

	vector<Matrix<floatPrec, 4, 4>> outTrans;
	Matrix<floatPrec, 4, 4> auxTrans;
	Matrix<floatPrec, 3, 3> auxRot;
	Matrix<floatPrec, 3, 1> auxT;

	floatPrec pi11, pi12, pi13, pi14;
	floatPrec pi21, pi22, pi23, pi24;
	floatPrec nu11, nu12, nu13, nu14;
	floatPrec nu21, nu22, nu23, nu24;

	pi11 = Pi1(0);
	pi12 = Pi1(1);
	pi13 = Pi1(2);
	pi14 = Pi1(3);
	pi21 = Pi2(0);
	pi22 = Pi2(1);
	pi23 = Pi2(2);
	pi24 = Pi2(3);
	nu11 = Nu1(0);
	nu12 = Nu1(1);
	nu13 = Nu1(2);
	nu14 = Nu1(3);
	nu21 = Nu2(0);
	nu22 = Nu2(1);
	nu23 = Nu2(2);
	nu24 = Nu2(3);

	// Compute U Matrix
	auxRot << 1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi23 - pi13 * pi22) * (pi12 * pi12 + pi13 * pi13),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi11 * pi23 - pi13 * pi21) * (pi12 * pi12 + pi13 * pi13),
		1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi11 * pi22 - pi12 * pi21) * (pi12 * pi12 + pi13 * pi13),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi22 + (pi13 * pi13) * pi22 - pi11 * pi12 * pi21 - pi12 * pi13 * pi23),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi23 + (pi12 * pi12) * pi23 - pi11 * pi13 * pi21 - pi12 * pi13 * pi22),
		pi11 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi12 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi13 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	// Compute u vector
	auxT << 0.0,
		-1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi24 + (pi12 * pi12) * pi24 + (pi13 * pi13) * pi24 - pi11 * pi14 * pi21 - pi12 * pi14 * pi22 - pi13 * pi14 * pi23) * 1.0 / sqrt((pi11 * pi11) * (pi22 * pi22) + (pi12 * pi12) * (pi21 * pi21) + (pi11 * pi11) * (pi23 * pi23) + (pi13 * pi13) * (pi21 * pi21) + (pi12 * pi12) * (pi23 * pi23) + (pi13 * pi13) * (pi22 * pi22) - pi11 * pi12 * pi21 * pi22 * 2.0 - pi11 * pi13 * pi21 * pi23 * 2.0 - pi12 * pi13 * pi22 * pi23 * 2.0),
		pi14 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [U,u;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add U,u to the output vector
	outTrans.push_back(auxTrans);

	// Compute V Matrix
	auxRot << 1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu23 - nu13 * nu22) * (nu12 * nu12 + nu13 * nu13),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu11 * nu23 - nu13 * nu21) * (nu12 * nu12 + nu13 * nu13),
		1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu11 * nu22 - nu12 * nu21) * (nu12 * nu12 + nu13 * nu13),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu22 + (nu13 * nu13) * nu22 - nu11 * nu12 * nu21 - nu12 * nu13 * nu23),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu23 + (nu12 * nu12) * nu23 - nu11 * nu13 * nu21 - nu12 * nu13 * nu22),
		nu11 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu12 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu13 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	// Compute v vector
	auxT << 0.0,
		-1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu24 + (nu12 * nu12) * nu24 + (nu13 * nu13) * nu24 - nu11 * nu14 * nu21 - nu12 * nu14 * nu22 - nu13 * nu14 * nu23) * 1.0 / sqrt((nu11 * nu11) * (nu22 * nu22) + (nu12 * nu12) * (nu21 * nu21) + (nu11 * nu11) * (nu23 * nu23) + (nu13 * nu13) * (nu21 * nu21) + (nu12 * nu12) * (nu23 * nu23) + (nu13 * nu13) * (nu22 * nu22) - nu11 * nu12 * nu21 * nu22 * 2.0 - nu11 * nu13 * nu21 * nu23 * 2.0 - nu12 * nu13 * nu22 * nu23 * 2.0),
		nu14 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [V,v;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add V,v to the output vector
	outTrans.push_back(auxTrans);

	return outTrans;
}